

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint _c;
  size_t _elemsize;
  Mat *pMVar2;
  int iVar3;
  pointer pMVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  void *pvVar12;
  size_t sVar13;
  ulong uVar14;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  if (uVar1 == 1) {
    lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar4;
    if (lVar10 == 0) {
      iVar9 = 0;
    }
    else {
      lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
      lVar10 = lVar10 + (ulong)(lVar10 == 0);
      piVar11 = &pMVar4->w;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + *piVar11;
        piVar11 = piVar11 + 0x12;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar2,iVar9,_elemsize,opt->blob_allocator);
    pvVar12 = pMVar2->data;
    if (pvVar12 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar2->c * pMVar2->cstep == 0) {
      return -100;
    }
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar4) {
      lVar10 = 0;
      uVar8 = 0;
      do {
        sVar13 = (long)*(int *)((long)&pMVar4->w + lVar10) * _elemsize;
        memcpy(pvVar12,*(void **)((long)&pMVar4->data + lVar10),sVar13);
        pvVar12 = (void *)((long)pvVar12 + sVar13);
        uVar8 = uVar8 + 1;
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x48;
      } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3)
                              * -0x71c71c71c71c71c7));
    }
  }
  else {
    iVar9 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar9 == 0)) {
      iVar9 = pMVar4->w;
      lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
      if (lVar10 == 0) {
        iVar3 = 0;
      }
      else {
        lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        piVar11 = &pMVar4->h;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar11;
          piVar11 = piVar11 + 0x12;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar9,iVar3,_elemsize,opt->blob_allocator);
      pvVar12 = pMVar2->data;
      if (pvVar12 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar4) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          sVar13 = (long)*(int *)((long)&pMVar4->h + lVar10) * (long)iVar9 * _elemsize;
          memcpy(pvVar12,*(void **)((long)&pMVar4->data + lVar10),sVar13);
          pvVar12 = (void *)((long)pvVar12 + sVar13);
          uVar8 = uVar8 + 1;
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x48;
        } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    else if ((uVar1 == 2) && (iVar9 == 1)) {
      uVar1 = pMVar4->h;
      lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
      if (lVar10 == 0) {
        iVar9 = 0;
      }
      else {
        lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        piVar11 = &pMVar4->w;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0x12;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar9,uVar1,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish != pMVar4) {
            pvVar12 = (void *)((long)pMVar2->w * uVar8 * pMVar2->elemsize + (long)pMVar2->data);
            lVar10 = 0x2c;
            uVar14 = 0;
            do {
              lVar5 = (long)*(int *)((long)&pMVar4->data + lVar10);
              memcpy(pvVar12,(void *)(uVar8 * lVar5 * *(long *)((long)pMVar4 + lVar10 + -0x1c) +
                                     *(long *)((long)pMVar4 + lVar10 + -0x2c)),lVar5 * _elemsize);
              pvVar12 = (void *)((long)pvVar12 +
                                (long)*(int *)((long)&pMVar4->data + lVar10) * _elemsize);
              uVar14 = uVar14 + 1;
              pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar10 = lVar10 + 0x48;
            } while (uVar14 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar4 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar1);
        return 0;
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 0)) {
      lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
      if (lVar10 == 0) {
        iVar9 = 0;
      }
      else {
        lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        piVar11 = &pMVar4->c;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0x12;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,pMVar4->w,pMVar4->h,iVar9,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar4) {
        lVar10 = 0x40;
        iVar9 = 0;
        uVar8 = 0;
        do {
          iVar3 = *(int *)((long)pMVar4 + lVar10 + -8);
          memcpy((void *)(pMVar2->cstep * (long)iVar9 * pMVar2->elemsize + (long)pMVar2->data),
                 *(void **)((long)pMVar4 + lVar10 + -0x40),
                 (long)iVar3 * _elemsize * *(long *)((long)&pMVar4->data + lVar10));
          iVar9 = iVar9 + iVar3;
          uVar8 = uVar8 + 1;
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x48;
        } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >>
                                 3) * -0x71c71c71c71c71c7));
        return 0;
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 1)) {
      uVar1 = pMVar4->c;
      lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
      if (lVar10 == 0) {
        iVar9 = 0;
      }
      else {
        lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        piVar11 = &pMVar4->h;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0x12;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,pMVar4->w,iVar9,uVar1,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish != pMVar4) {
            pvVar12 = (void *)(pMVar2->cstep * uVar8 * pMVar2->elemsize + (long)pMVar2->data);
            lVar10 = 0x40;
            uVar14 = 0;
            do {
              sVar13 = (long)*(int *)((long)pMVar4 + lVar10 + -0x10) *
                       (long)*(int *)((long)pMVar4 + lVar10 + -0x14) * _elemsize;
              memcpy(pvVar12,(void *)(*(long *)((long)&pMVar4->data + lVar10) * uVar8 *
                                      *(long *)((long)pMVar4 + lVar10 + -0x30) +
                                     *(long *)((long)pMVar4 + lVar10 + -0x40)),sVar13);
              pvVar12 = (void *)((long)pvVar12 + sVar13);
              uVar14 = uVar14 + 1;
              pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar10 = lVar10 + 0x48;
            } while (uVar14 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar4 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar1);
        return 0;
      }
    }
    else {
      if (uVar1 != 3) {
        return 0;
      }
      if (iVar9 != 2) {
        return 0;
      }
      uVar1 = pMVar4->h;
      _c = pMVar4->c;
      lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4;
      if (lVar10 == 0) {
        iVar9 = 0;
      }
      else {
        lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        piVar11 = &pMVar4->w;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0x12;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar9,uVar1,_c,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)_c) {
        uVar8 = 0;
        do {
          if (0 < (int)uVar1) {
            pvVar12 = (void *)(pMVar2->cstep * uVar8 * pMVar2->elemsize + (long)pMVar2->data);
            uVar14 = 0;
            do {
              pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish != pMVar4) {
                lVar10 = 0x40;
                uVar7 = 0;
                do {
                  lVar6 = (long)*(int *)((long)pMVar4 + lVar10 + -0x14);
                  lVar5 = *(long *)((long)pMVar4 + lVar10 + -0x30);
                  memcpy(pvVar12,(void *)(uVar14 * lVar6 * lVar5 +
                                         *(long *)((long)&pMVar4->data + lVar10) * uVar8 * lVar5 +
                                         *(long *)((long)pMVar4 + lVar10 + -0x40)),lVar6 * _elemsize
                        );
                  pvVar12 = (void *)((long)*(int *)((long)pMVar4 + lVar10 + -0x14) * _elemsize +
                                    (long)pvVar12);
                  uVar7 = uVar7 + 1;
                  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar10 = lVar10 + 0x48;
                } while (uVar7 < (ulong)(((long)(bottom_blobs->
                                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pMVar4 >> 3) * -0x71c71c71c71c71c7));
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != _c);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}